

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzer.cpp
# Opt level: O1

void __thiscall MDIOAnalyzer::ProcessRegAddrDevTypeFrame(MDIOAnalyzer *this)

{
  long lVar1;
  char cVar2;
  int iVar3;
  DataBuilder opcode;
  Frame frame;
  U64 value;
  DataBuilder aDStack_68 [8];
  long local_60;
  undefined8 local_58;
  ulong local_50;
  char local_40;
  undefined1 local_3f;
  ulong local_38;
  
  lVar1 = AnalyzerChannelData::GetSampleNumber();
  DataBuilder::DataBuilder(aDStack_68);
  iVar3 = 5;
  DataBuilder::Reset((ulonglong *)aDStack_68,(ShiftOrder)&local_38,0);
  do {
    GetBit(this,(BitState *)&local_60,&this->mMdcPosedgeArrows);
    DataBuilder::AddBit((BitState)aDStack_68);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  Frame::Frame((Frame *)&local_60);
  cVar2 = '\x0e';
  if (local_38 < 6) {
    cVar2 = (char)local_38 + '\b';
  }
  local_40 = '\a';
  if ((this->mCurrentPacket).clause != MDIO_C22_PACKET) {
    local_40 = cVar2;
  }
  local_50 = local_38;
  local_3f = 0;
  local_60 = lVar1 + 1;
  local_58 = AnalyzerChannelData::GetSampleNumber();
  AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
  Analyzer::ReportProgress((ulonglong)this);
  Frame::~Frame((Frame *)&local_60);
  DataBuilder::~DataBuilder(aDStack_68);
  return;
}

Assistant:

void MDIOAnalyzer::ProcessRegAddrDevTypeFrame()
{
    // starting sample of the start frame
    U64 starting_sample = mMdio->GetSampleNumber() + 1;

    // get the value of the 5 bits of register address or devtype frame
    DataBuilder opcode;
    U64 value;
    opcode.Reset( &value, AnalyzerEnums::MsbFirst, 5 );
    for( U32 i = 0; i < 5; ++i )
    {
        BitState bit;
        GetBit( bit, mMdcPosedgeArrows );
        opcode.AddBit( bit );
    }

    // create and set the phyaddr frame
    Frame frame;
    if( mCurrentPacket.clause == MDIO_C22_PACKET )
    {
        frame.mType = MDIO_C22_REGADDR;
    }
    else
    {
        frame.mType = GetDevType( value );
    }
    frame.mData1 = value;
    frame.mFlags = 0;
    frame.mStartingSampleInclusive = starting_sample;
    frame.mEndingSampleInclusive = mMdio->GetSampleNumber();

    mResults->AddFrame( frame );
    ReportProgress( frame.mEndingSampleInclusive );
}